

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_traits.h
# Opt level: O2

StatusOr<int>
google::protobuf::json_internal::Proto2Descriptor::EnumNumberByName
          (Field f,string_view name,bool case_insensitive)

{
  char cVar1;
  EnumDescriptor *pEVar2;
  EnumValueDescriptor *pEVar3;
  undefined7 in_register_00000009;
  char *pcVar4;
  char *pcVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  undefined8 extraout_RDX_01;
  int i;
  int iVar7;
  FieldDescriptor *this;
  int in_R8D;
  StatusOr<int> SVar8;
  string_view name_00;
  Status SStack_78;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string local_60;
  FormatSpec<std::basic_string_view<char>_> local_40;
  
  pcVar4 = (char *)CONCAT71(in_register_00000009,case_insensitive);
  pcVar5 = name._M_str;
  this = (FieldDescriptor *)name._M_len;
  local_70._M_len = (size_t)pcVar5;
  local_70._M_str = pcVar4;
  if (in_R8D == 0) {
    pEVar2 = FieldDescriptor::enum_type(this);
    name_00._M_str = pcVar4;
    name_00._M_len = (size_t)pcVar5;
    pEVar3 = EnumDescriptor::FindValueByName(pEVar2,name_00);
    if (pEVar3 == (EnumValueDescriptor *)0x0) {
      local_40.super_type.spec_.data_ = "unknown enum value: \'%s\'";
      local_40.super_type.spec_.size_ = 0x18;
      absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                (&local_60,&local_40,&local_70);
      absl::lts_20240722::InvalidArgumentError
                (&SStack_78,local_60._M_string_length,local_60._M_dataplus._M_p);
      absl::lts_20240722::internal_statusor::StatusOrData<int>::
      StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&SStack_78);
LAB_00298440:
      absl::lts_20240722::Status::~Status(&SStack_78);
      std::__cxx11::string::~string((string *)&local_60);
      uVar6 = extraout_RDX_01;
      goto LAB_00298452;
    }
    iVar7 = pEVar3->number_;
    uVar6 = extraout_RDX_00;
  }
  else {
    iVar7 = 0;
    do {
      pEVar2 = FieldDescriptor::enum_type(this);
      if (pEVar2->value_count_ <= iVar7) {
        local_40.super_type.spec_.data_ = "unknown enum value: \'%s\'";
        local_40.super_type.spec_.size_ = 0x18;
        absl::lts_20240722::StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                  (&local_60,&local_40,&local_70);
        absl::lts_20240722::InvalidArgumentError
                  (&SStack_78,local_60._M_string_length,local_60._M_dataplus._M_p);
        absl::lts_20240722::internal_statusor::StatusOrData<int>::
        StatusOrData<absl::lts_20240722::Status,_0>((StatusOrData<int> *)f,&SStack_78);
        goto LAB_00298440;
      }
      pEVar2 = FieldDescriptor::enum_type(this);
      pEVar3 = EnumDescriptor::value(pEVar2,iVar7);
      cVar1 = absl::lts_20240722::EqualsIgnoreCase
                        (pcVar5,pcVar4,pEVar3->all_names_->_M_string_length,
                         (pEVar3->all_names_->_M_dataplus)._M_p);
      iVar7 = iVar7 + 1;
    } while (cVar1 == '\0');
    iVar7 = pEVar3->number_;
    uVar6 = extraout_RDX;
  }
  *(int *)&f->all_names_ = iVar7;
  f->super_SymbolBase = '\x01';
  f->field_0x1 = 0;
  f->type_ = '\0';
  f->field_0x3 = 0;
  f->number_ = 0;
LAB_00298452:
  SVar8.super_StatusOrData<int>._8_8_ = uVar6;
  SVar8.super_StatusOrData<int>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)f;
  return (StatusOr<int>)SVar8.super_StatusOrData<int>;
}

Assistant:

static absl::StatusOr<int32_t> EnumNumberByName(Field f,
                                                  absl::string_view name,
                                                  bool case_insensitive) {
    if (case_insensitive) {
      for (int i = 0; i < f->enum_type()->value_count(); ++i) {
        const auto* ev = f->enum_type()->value(i);
        if (absl::EqualsIgnoreCase(name, ev->name())) {
          return ev->number();
        }
      }
      return absl::InvalidArgumentError(
          absl::StrFormat("unknown enum value: '%s'", name));
    }

    if (const auto* ev = f->enum_type()->FindValueByName(name)) {
      return ev->number();
    }

    return absl::InvalidArgumentError(
        absl::StrFormat("unknown enum value: '%s'", name));
  }